

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolIndexSearch.h
# Opt level: O2

string * __thiscall
SymbolIndexSearch::operator()[abi_cxx11_
          (string *__return_storage_ptr__,SymbolIndexSearch *this,Token *token)

{
  size_t sVar1;
  char *pcVar2;
  pointer pbVar3;
  undefined1 uVar4;
  size_type sVar5;
  Page *pPVar6;
  string_view *v;
  undefined1 this_00 [8];
  string *htmlPage;
  string_view str;
  string_view delimiter;
  string_view subtoken;
  string_view subtoken_00;
  string_view subtoken_01;
  string local_120;
  string local_100;
  string local_e0;
  undefined1 local_c0 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  subtokens;
  char *local_98;
  string local_90;
  ulong local_70;
  undefined1 auStack_68 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  allocator<char> local_32;
  allocator<char> local_31;
  
  if (token->type == std) {
    str._M_str = (token->content)._M_dataplus._M_p;
    str._M_len = (token->content)._M_string_length;
    delimiter._M_str = "::";
    delimiter._M_len = 2;
    ::str::split((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_c0,str,delimiter);
    pbVar3 = subtokens.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (this_00 = local_c0; this_00 != (undefined1  [8])pbVar3;
        this_00 = (undefined1  [8])((long)this_00 + 0x10)) {
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00,'<',0);
      if (sVar5 != 0xffffffffffffffff) {
        ((basic_string_view<char,_std::char_traits<char>_> *)this_00)->_M_len = sVar5;
      }
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00,'(',0);
      if (sVar5 != 0xffffffffffffffff) {
        ((basic_string_view<char,_std::char_traits<char>_> *)this_00)->_M_len = sVar5;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"/w/cpp/symbol_index",(allocator<char> *)&local_90);
    pPVar6 = SearchBase::getPage(&this->super_SearchBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    local_70 = 1;
    link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = true;
    link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _17_7_ = 0;
    while( true ) {
      if ((ulong)((long)subtokens.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)local_c0 >> 4) <= local_70
         ) break;
      link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str =
           (char *)((ulong)link.
                           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                           ._M_payload._M_value._M_str & 0xffffffffffffff00);
      sVar1 = *(size_t *)
               ((long)local_c0 +
               link.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _16_8_ + -8);
      pcVar2 = *(char **)((long)(size_t *)local_c0 +
                         link.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._16_8_);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"<span>",&local_32);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"</span>",&local_31);
      htmlPage = &pPVar6->content;
      subtoken._M_str = pcVar2;
      subtoken._M_len = sVar1;
      SearchBase::findLinkToSubtoken
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &subtokens.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_SearchBase,
                 htmlPage,subtoken,&local_90,&local_e0);
      link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = local_98;
      auStack_68 = (undefined1  [8])
                   subtokens.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_90);
      if (link.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._8_1_ == '\0') {
        sVar1 = *(size_t *)
                 ((long)local_c0 +
                 link.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._16_8_ + -8);
        pcVar2 = *(char **)((long)(size_t *)local_c0 +
                           link.
                           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                           ._16_8_);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"<code>",&local_32);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"</code>",&local_31);
        subtoken_00._M_str = pcVar2;
        subtoken_00._M_len = sVar1;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &subtokens.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_SearchBase,
                   htmlPage,subtoken_00,&local_90,&local_e0);
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = local_98;
        auStack_68 = (undefined1  [8])
                     subtokens.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      uVar4 = link.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._8_1_;
      if ((link.
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _M_payload._8_1_ & 1) == 0) {
        sVar1 = *(size_t *)
                 ((long)local_c0 +
                 link.
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._16_8_ + -8);
        pcVar2 = *(char **)((long)(size_t *)local_c0 +
                           link.
                           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                           ._16_8_);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"<tt>",&local_32);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"</tt>",&local_31);
        subtoken_01._M_str = pcVar2;
        subtoken_01._M_len = sVar1;
        SearchBase::findLinkToSubtoken
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &subtokens.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_SearchBase,
                   htmlPage,subtoken_01,&local_90,&local_e0);
        link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_str = local_98;
        auStack_68 = (undefined1  [8])
                     subtokens.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_90);
        uVar4 = link.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._8_1_;
      }
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_90);
        goto LAB_001833b8;
      }
      if (local_70 ==
          ((long)subtokens.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start - (long)local_c0 >> 4) - 1U) {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)__return_storage_ptr__,
                   (basic_string_view<char,_std::char_traits<char>_> *)auStack_68,
                   (allocator<char> *)&local_90);
        goto LAB_001833b8;
      }
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_120,(basic_string_view<char,_std::char_traits<char>_> *)auStack_68
                 ,(allocator<char> *)&local_90);
      pPVar6 = SearchBase::getPage(&this->super_SearchBase,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      local_70 = local_70 + 1;
      link.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           link.
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _16_8_ + 0x10;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_90);
LAB_001833b8:
    std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_c0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
		if (token.type != Token::Type::std) {
			return "";
		}

		std::vector<std::string_view> subtokens = str::split(token.content, "::");
		for (std::string_view& v : subtokens) {
			const size_t start_template = v.find('<');
			if (start_template != std::string_view::npos) {
				v.remove_suffix(v.size() - start_template);
			}

			const size_t start_parenthesis = v.find('(');
			if (start_parenthesis != std::string_view::npos) {
				v.remove_suffix(v.size() - start_parenthesis);
			}
		}

		Page* page = getPage("/w/cpp/symbol_index");
		for (size_t i = 1; i < subtokens.size(); i++) {
			std::optional<std::string_view> link;

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<span>", "</span>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<code>", "</code>");
			}

			if (!link.has_value()) {
				link = findLinkToSubtoken(page->content, subtokens[i], "<tt>", "</tt>");
			}

			if (!link.has_value()) {
				return "";
			}


			if (i == subtokens.size() - 1) {
				return std::string(link.value());
			}

			page = getPage(std::string(link.value()));
		}

		return "";
	}